

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string *configPath;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  Config config;
  InputParser parser;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = argc;
  InputParser::InputParser((InputParser *)&config.template_,(int *)((long)&argv_local + 4),argv);
  Angelsen::Config::Config((Config *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"-config",&local_169);
  configPath = InputParser::getCmdOption((InputParser *)&config.template_,&local_168);
  Angelsen::Config::updateFromJson((Config *)local_148,configPath);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  Angelsen::Config::loadTemplate((Config *)local_148);
  Angelsen::runServer((Config *)local_148);
  Angelsen::Config::~Config((Config *)local_148);
  InputParser::~InputParser((InputParser *)&config.template_);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    InputParser parser(argc, argv);

    Angelsen::Config config;
    config.updateFromJson(parser.getCmdOption("-config"));
    config.loadTemplate();

    Angelsen::runServer(config);
}